

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vec2 __thiscall djb::microfacet::h2_to_u2(microfacet *this,vec3 *wm,vec3 *wi,args *args)

{
  vec2 extraout_XMM0_Qa;
  vec3 local_58;
  vec3 local_48;
  vec3 local_38;
  
  local_58 = djb::operator*(&args->minv,wi);
  local_38 = normalize(&local_58);
  local_48 = djb::operator*(&args->mtra,wm);
  local_58 = normalize(&local_48);
  (*(this->super_brdf)._vptr_brdf[0xd])(this,&local_58,&local_38);
  return extraout_XMM0_Qa;
}

Assistant:

vec2
microfacet::h2_to_u2(
	const vec3 &wm, const vec3 &wi, const args &args
) const {
	vec3 wi_std = normalize(args.minv * wi);
	vec3 wm_std = normalize(args.mtra * wm);

	return h2_to_u2_std(wm_std, wi_std);
}